

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O0

string * __thiscall Character::HomeString_abi_cxx11_(string *__return_storage_ptr__,Character *this)

{
  Home *pHVar1;
  Character *this_local;
  
  pHVar1 = World::GetHome(this->world,this);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&pHVar1->name);
  return __return_storage_ptr__;
}

Assistant:

std::string Character::HomeString() const
{
	return this->world->GetHome(this)->name;
}